

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.cpp
# Opt level: O3

void __thiscall btBoxShape::btBoxShape(btBoxShape *this,btVector3 *boxHalfExtents)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  btPolyhedralConvexShape::btPolyhedralConvexShape(&this->super_btPolyhedralConvexShape);
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btPolyhedralConvexShape_0021cc40;
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape.m_shapeType = 0;
  btConvexInternalShape::setSafeMargin((btConvexInternalShape *)this,boxHalfExtents,0.1);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  uVar1 = *(undefined8 *)
           &(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape.field_0x1c;
  auVar2._4_4_ = (float)((ulong)uVar1 >> 0x20) *
                 (float)((ulong)*(undefined8 *)boxHalfExtents->m_floats >> 0x20) -
                 extraout_XMM0_Da_00;
  auVar2._0_4_ = (float)uVar1 * (float)*(undefined8 *)boxHalfExtents->m_floats - extraout_XMM0_Da;
  auVar2._8_4_ = boxHalfExtents->m_floats[2] *
                 *(float *)&(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                            field_0x24 - extraout_XMM0_Da_01;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])
   (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar2;
  return;
}

Assistant:

btBoxShape::btBoxShape( const btVector3& boxHalfExtents) 
: btPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	setSafeMargin(boxHalfExtents);

	btVector3 margin(getMargin(),getMargin(),getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;
}